

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O1

void __thiscall xLearn::Model::Model(Model *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  Logger local_74;
  string local_70;
  string local_50;
  
  (this->score_func_)._M_dataplus._M_p = (pointer)&(this->score_func_).field_2;
  (this->score_func_)._M_string_length = 0;
  (this->score_func_).field_2._M_local_buf[0] = '\0';
  (this->loss_func_)._M_dataplus._M_p = (pointer)&(this->loss_func_).field_2;
  (this->loss_func_)._M_string_length = 0;
  (this->loss_func_).field_2._M_local_buf[0] = '\0';
  this->param_w_ = (real_t *)0x0;
  this->param_v_ = (real_t *)0x0;
  this->param_b_ = (real_t *)0x0;
  this->param_best_w_ = (real_t *)0x0;
  this->param_b_ = (real_t *)0x0;
  this->param_best_w_ = (real_t *)0x0;
  this->param_best_v_ = (real_t *)0x0;
  this->param_best_b_ = (real_t *)0x0;
  if (filename->_M_string_length == 0) {
    local_74.severity_ = ERR;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
               ,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Model","");
    poVar2 = Logger::Start(ERR,&local_70,0xca,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xca);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"filename.empty()",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    Logger::~Logger(&local_74);
    abort();
  }
  bVar1 = Deserialize(this,filename);
  if (bVar1) {
    return;
  }
  StringPrintf_abi_cxx11_
            (&local_70,"Cannot Load model from the file: %s",(filename->_M_dataplus)._M_p);
  Color::print_error(&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  exit(0);
}

Assistant:

Model::Model(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
  if (this->Deserialize(filename) == false) {
    Color::print_error(
      StringPrintf("Cannot Load model from the file: %s",
           filename.c_str())
    );
    exit(0);
  }
}